

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O3

Own<capnp::ClientHook> capnp::anon_unknown_0::newNullCap(void)

{
  uint *puVar1;
  BrokenClient *this;
  ClientHook *extraout_RDX;
  undefined8 *in_RDI;
  Own<capnp::ClientHook> OVar2;
  StringPtr description;
  
  this = (BrokenClient *)operator_new(0x180);
  description.content.size_ = 0x18;
  description.content.ptr = "Called null capability.";
  BrokenClient::BrokenClient(this,description,true,&ClientHook::NULL_CAPABILITY_BRAND);
  puVar1 = &(this->super_Refcounted).refcount;
  *puVar1 = *puVar1 + 1;
  OVar2.disposer = &this->super_Refcounted;
  *in_RDI = OVar2.disposer;
  in_RDI[1] = this;
  OVar2.ptr = extraout_RDX;
  return OVar2;
}

Assistant:

kj::Own<ClientHook> newNullCap() {
  // A null capability, unlike other broken capabilities, is considered resolved.
  return kj::refcounted<BrokenClient>("Called null capability.", true,
                                      &ClientHook::NULL_CAPABILITY_BRAND);
}